

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  uint uVar1;
  char local_b8 [4];
  int index;
  char name [64];
  char *local_70;
  char *texsuffix;
  char var [64];
  int tb_local;
  TextureType ttype_local;
  int stage_local;
  Context *ctx_local;
  
  if (ttype == TEXTURE_TYPE_2D) {
    local_70 = "2d";
  }
  else if (ttype == TEXTURE_TYPE_CUBE) {
    local_70 = "cube";
  }
  else {
    if (ttype != TEXTURE_TYPE_VOLUME) {
      __assert_fail("!\"unexpected texture type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x12d2,"void emit_METAL_sampler(Context *, int, TextureType, int)");
    }
    local_70 = "3d";
  }
  get_METAL_varname_in_buf(ctx,REG_TYPE_SAMPLER,stage,(char *)&texsuffix,0x40);
  push_output(ctx,&ctx->mainline_arguments);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"texture%s<float> %s_texture [[texture(%d)]],",local_70,&texsuffix,
              (ulong)(uint)stage);
  output_line(ctx,"sampler %s [[sampler(%d)]],",&texsuffix,(ulong)(uint)stage);
  pop_output(ctx);
  if (tb != 0) {
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    uVar1 = ctx->uniform_float4_count;
    ctx->uniform_float4_count = ctx->uniform_float4_count + 2;
    get_METAL_uniform_array_varname(ctx,REG_TYPE_CONST,local_b8,0x40);
    output_line(ctx,"constant float4 &%s_texbem = %s[%d];",&texsuffix,local_b8,(ulong)uVar1);
    output_line(ctx,"constant float4 &%s_texbeml = %s[%d];",&texsuffix,local_b8,(ulong)(uVar1 + 1));
    pop_output(ctx);
  }
  return;
}

Assistant:

static void emit_METAL_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    char var[64];
    const char *texsuffix = NULL;
    switch (ttype)
    {
        case TEXTURE_TYPE_2D: texsuffix = "2d"; break;
        case TEXTURE_TYPE_CUBE: texsuffix = "cube"; break;
        case TEXTURE_TYPE_VOLUME: texsuffix = "3d"; break;
        default: assert(!"unexpected texture type"); return;
    } // switch

    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof (var));

    push_output(ctx, &ctx->mainline_arguments);
    ctx->indent++;
    output_line(ctx, "texture%s<float> %s_texture [[texture(%d)]],",
                texsuffix, var, stage);
    output_line(ctx, "sampler %s [[sampler(%d)]],", var, stage);
    pop_output(ctx);

    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        push_output(ctx, &ctx->mainline_top);
        ctx->indent++;
        char name[64];
        const int index = ctx->uniform_float4_count;
        ctx->uniform_float4_count += 2;
        get_METAL_uniform_array_varname(ctx, REG_TYPE_CONST, name, sizeof (name));
        output_line(ctx, "constant float4 &%s_texbem = %s[%d];", var, name, index);
        output_line(ctx, "constant float4 &%s_texbeml = %s[%d];", var, name, index+1);
        pop_output(ctx);
    } // if
}